

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WidgetDropDown.cpp
# Opt level: O3

int __thiscall
Rml::WidgetDropDown::AddOption
          (WidgetDropDown *this,String *rml,String *option_value,int before,bool select,
          bool selectable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Element *pEVar3;
  int iVar4;
  undefined3 in_register_00000089;
  Element *local_a0;
  String local_98;
  _Head_base<0UL,_Rml::Element_*,_false> local_78;
  String local_70;
  int local_50;
  undefined4 local_4c;
  XMLAttributes local_48;
  
  local_4c = CONCAT31(in_register_00000089,selectable);
  pEVar3 = this->selection_element;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_50 = before;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"*","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"option","");
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement((Factory *)&local_a0,pEVar3,&local_98,&local_70,&local_48);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  Element::SetInnerRML(local_a0,rml);
  pEVar3 = local_a0;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"value","");
  Element::SetAttribute<std::__cxx11::string>(pEVar3,&local_98,option_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pEVar3 = local_a0;
  paVar2 = &local_70.field_2;
  if (select) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"selected","");
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar2;
    Element::SetAttribute<std::__cxx11::string>(pEVar3,&local_98,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  pEVar3 = local_a0;
  if ((char)local_4c == '\0') {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"disabled","");
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar2;
    Element::SetAttribute<std::__cxx11::string>(pEVar3,&local_98,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  local_78._M_head_impl = local_a0;
  local_a0 = (Element *)0x0;
  iVar4 = AddOption(this,(ElementPtr *)&local_78,local_50);
  if (local_78._M_head_impl != (Element *)0x0) {
    (*((local_78._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
  }
  local_78._M_head_impl = (Element *)0x0;
  if (local_a0 != (Element *)0x0) {
    (**(code **)(*(long *)local_a0 + 0x10))();
  }
  return iVar4;
}

Assistant:

int WidgetDropDown::AddOption(const String& rml, const String& option_value, int before, bool select, bool selectable)
{
	ElementPtr element = Factory::InstanceElement(selection_element, "*", "option", XMLAttributes());
	element->SetInnerRML(rml);

	element->SetAttribute("value", option_value);

	if (select)
		element->SetAttribute("selected", String());
	if (!selectable)
		element->SetAttribute("disabled", String());

	int result = AddOption(std::move(element), before);

	return result;
}